

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

void __thiscall spirv_cross::CompilerMSL::activate_argument_buffer_resources(CompilerMSL *this)

{
  ID id;
  size_t sVar1;
  TypedID<(spirv_cross::Types)0> *pTVar2;
  Variant *pVVar3;
  bool bVar4;
  uint32_t uVar5;
  long lVar6;
  LoopLock loop_lock;
  LoopLock local_30;
  
  ParsedIR::create_loop_hard_lock(&(this->super_CompilerGLSL).super_Compiler.ir);
  sVar1 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[2].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  if (sVar1 != 0) {
    pTVar2 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[2].
             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    lVar6 = 0;
    do {
      id.id = *(uint32_t *)((long)&pTVar2->id + lVar6);
      pVVar3 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.ptr;
      if (pVVar3[id.id].type == TypeVariable) {
        Variant::get<spirv_cross::SPIRVariable>(pVVar3 + id.id);
        bVar4 = Compiler::has_decoration((Compiler *)this,id,DecorationDescriptorSet);
        if (bVar4) {
          uVar5 = Compiler::get_decoration((Compiler *)this,id,DecorationDescriptorSet);
          if (((uVar5 < 8) && ((this->msl_options).argument_buffers != false)) &&
             ((this->argument_buffer_discrete_mask >> (uVar5 & 0x1f) & 1) == 0)) {
            Compiler::add_active_interface_variable((Compiler *)this,id.id);
          }
        }
      }
      lVar6 = lVar6 + 4;
    } while (sVar1 << 2 != lVar6);
  }
  ParsedIR::LoopLock::~LoopLock(&local_30);
  return;
}

Assistant:

void CompilerMSL::activate_argument_buffer_resources()
{
	// For ABI compatibility, force-enable all resources which are part of argument buffers.
	ir.for_each_typed_id<SPIRVariable>([&](uint32_t self, const SPIRVariable &) {
		if (!has_decoration(self, DecorationDescriptorSet))
			return;

		uint32_t desc_set = get_decoration(self, DecorationDescriptorSet);
		if (descriptor_set_is_argument_buffer(desc_set))
			add_active_interface_variable(self);
	});
}